

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result wabt::ParseWastScript
                 (WastLexer *lexer,
                 unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script,
                 Errors *errors,WastParseOptions *options)

{
  Result RVar1;
  long lVar2;
  Enum EVar3;
  WastParser parser;
  undefined8 uStack_f0;
  undefined1 auStack_e4 [4];
  undefined1 auStack_e0 [16];
  WastParser local_d0;
  
  if (out_script == (unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)0x0) {
    auStack_e0._0_8_ = 0x143680;
    __assert_fail("out_script != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                  ,0xe0b,
                  "Result wabt::ParseWastScript(WastLexer *, std::unique_ptr<Script> *, Errors *, WastParseOptions *)"
                 );
  }
  if (options != (WastParseOptions *)0x0) {
    local_d0.last_module_index_ = 0xffffffff;
    lVar2 = 0x40;
    do {
      *(undefined8 *)(auStack_e4 + lVar2) = 0;
      *(undefined8 *)(auStack_e0 + lVar2 + 4) = 0;
      *(undefined8 *)((long)&uStack_f0 + lVar2) = 0;
      *(undefined8 *)(&stack0xffffffffffffff18 + lVar2) = 0;
      *(undefined4 *)((long)local_d0.tokens_.contents_._M_elems + lVar2 + -0x20) = 0;
      lVar2 = lVar2 + 0x40;
    } while (lVar2 != 0xc0);
    local_d0.tokens_.size_ = 0;
    local_d0.tokens_.front_ = 0;
    auStack_e0._0_8_ = 0x14361e;
    local_d0.lexer_ = lexer;
    local_d0.errors_ = errors;
    local_d0.options_ = options;
    RVar1 = WastParser::ParseScript(&local_d0,out_script);
    EVar3 = Error;
    if (RVar1.enum_ != Error) {
      auStack_e0._0_8_ = 0x143633;
      RVar1 = ResolveNamesScript((out_script->_M_t).
                                 super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>
                                 .super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,errors);
      EVar3 = (Enum)(RVar1.enum_ == Error);
    }
    while (local_d0.tokens_.size_ != 0) {
      auStack_e0._0_8_ = 0x143646;
      CircularArray<wabt::Token,_2UL>::pop_back(&local_d0.tokens_);
    }
    return (Result)EVar3;
  }
  auStack_e0._0_8_ = anon_unknown_1::ResolveTypeNames;
  __assert_fail("options != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                ,0xe0c,
                "Result wabt::ParseWastScript(WastLexer *, std::unique_ptr<Script> *, Errors *, WastParseOptions *)"
               );
}

Assistant:

Result ParseWastScript(WastLexer* lexer,
                       std::unique_ptr<Script>* out_script,
                       Errors* errors,
                       WastParseOptions* options) {
  assert(out_script != nullptr);
  assert(options != nullptr);
  WastParser parser(lexer, errors, options);
  CHECK_RESULT(parser.ParseScript(out_script));
  CHECK_RESULT(ResolveNamesScript(out_script->get(), errors));
  return Result::Ok;
}